

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O3

void ncnn::conv_im2col_sgemm_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_requant,
               Option *opt)

{
  int *piVar1;
  float fVar2;
  size_t sVar3;
  size_t sVar4;
  pointer pfVar5;
  undefined1 uVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar12;
  void *pvVar13;
  undefined4 extraout_var_01;
  void *pvVar14;
  undefined1 *puVar15;
  char *pcVar16;
  uint uVar17;
  int iVar18;
  float fVar19;
  char *pcVar20;
  long lVar21;
  void *pvVar22;
  int n_1;
  undefined4 *puVar23;
  int iVar24;
  int iVar25;
  void *pvVar26;
  uint uVar27;
  int iVar28;
  void *pvVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  undefined1 *puVar33;
  void *pvVar34;
  char *pcVar35;
  long lVar36;
  void *pvVar37;
  int p;
  undefined1 *puVar38;
  undefined1 *puVar39;
  ulong uVar40;
  long lVar41;
  uint uVar42;
  void *pvVar43;
  char *ret;
  int iVar44;
  ulong uVar45;
  undefined4 uVar46;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar47 [12];
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined4 uVar52;
  undefined4 uVar53;
  void *ptr;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  void *local_1e8;
  void *local_1e0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  int *local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  undefined4 uStack_18c;
  undefined8 local_188;
  ulong local_170;
  undefined1 *local_168;
  long local_160;
  uint local_154;
  float local_150;
  float local_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  int *local_110;
  void *local_108;
  char *local_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  Allocator *local_c0;
  Allocator *local_b8;
  undefined1 *local_b0;
  int local_a8 [12];
  int *local_78;
  ulong local_70;
  Mat *local_68;
  ulong local_60;
  ulong local_58;
  char *local_50;
  undefined1 *local_48;
  Allocator *local_40;
  undefined1 *local_38;
  
  uVar11 = (ulong)(uint)stride_w;
  uVar27 = bottom_blob->w;
  local_1a8 = (undefined1 *)(ulong)(uint)bottom_blob->c;
  local_128 = (float)top_blob->h;
  local_f8 = (float)(kernel_h * kernel_w);
  uVar17 = bottom_blob->c * (int)local_f8;
  local_188 = (void *)CONCAT44(local_188._4_4_,top_blob->w);
  uVar8 = (int)local_128 * top_blob->w;
  local_170 = (ulong)top_blob->c;
  local_b8 = opt->workspace_allocator;
  local_e8 = _kernel;
  local_68 = top_blob;
  if (uVar8 * uVar17 == 0) {
    local_1b8 = (int *)0x0;
    pvVar14 = (void *)0x0;
  }
  else {
    local_198 = CONCAT44(local_198._4_4_,stride_w);
    uVar11 = (long)(int)(uVar8 * uVar17) + 3U & 0xfffffffffffffffc;
    if (local_b8 == (Allocator *)0x0) {
      local_1c8 = (void *)0x0;
      iVar9 = posix_memalign((void **)&local_1c8,0x10,uVar11 + 4);
      pvVar14 = (void *)0x0;
      if (iVar9 == 0) {
        pvVar14 = local_1c8;
      }
    }
    else {
      iVar9 = (*local_b8->_vptr_Allocator[2])();
      pvVar14 = (void *)CONCAT44(extraout_var,iVar9);
    }
    local_1b8 = (int *)((long)pvVar14 + uVar11);
    *(undefined4 *)((long)pvVar14 + uVar11) = 1;
    uVar11 = local_198 & 0xffffffff;
  }
  if (0 < (int)local_128) {
    local_1b0 = (ulong)(stride_h * uVar27);
    local_138._0_8_ = uVar11;
    lVar32 = 0;
    iVar9 = 0;
    fVar19 = 0.0;
    do {
      local_148._0_4_ = fVar19;
      local_d8._0_8_ = lVar32;
      if (0 < (int)(float)local_188) {
        iVar18 = 0;
        lVar31 = lVar32;
        do {
          local_198 = CONCAT44(local_198._4_4_,iVar18);
          if (0 < (int)(float)local_1a8) {
            puVar38 = (undefined1 *)0x0;
            do {
              if (0 < kernel_h) {
                sVar3 = bottom_blob->cstep;
                sVar4 = bottom_blob->elemsize;
                pvVar34 = bottom_blob->data;
                iVar24 = 0;
                lVar36 = lVar31;
                do {
                  if (0 < kernel_w) {
                    uVar40 = 0;
                    do {
                      *(undefined1 *)((long)pvVar14 + uVar40 + (long)iVar9) =
                           *(undefined1 *)
                            ((long)pvVar34 +
                            (long)((int)lVar36 + (int)uVar40) + sVar3 * (long)puVar38 * sVar4);
                      uVar40 = uVar40 + 1;
                    } while ((uint)kernel_w != uVar40);
                    iVar9 = iVar9 + (int)uVar40;
                  }
                  iVar24 = iVar24 + 1;
                  lVar36 = lVar36 + (ulong)uVar27;
                } while (iVar24 != kernel_h);
              }
              puVar38 = puVar38 + 1;
            } while (puVar38 != local_1a8);
          }
          iVar18 = iVar18 + 1;
          lVar31 = lVar31 + uVar11;
        } while ((float)iVar18 != (float)local_188);
      }
      fVar19 = (float)((int)fVar19 + 1);
      lVar32 = lVar32 + local_1b0;
    } while (fVar19 != local_128);
  }
  uVar27 = uVar8 + 3;
  if (-1 < (int)uVar8) {
    uVar27 = uVar8;
  }
  local_c0 = opt->workspace_allocator;
  local_f8 = (float)((int)local_f8 * (int)(float)local_1a8 * 4);
  uVar11 = (long)(int)local_f8 + 0xfU & 0xfffffffffffffff0;
  uVar40 = (long)(int)(uVar8 + ((int)uVar27 >> 2) * -3) * uVar11;
  local_108 = pvVar14;
  if (uVar40 == 0) {
    local_110 = (int *)0x0;
    local_1e8 = (void *)0x0;
  }
  else {
    if (local_c0 == (Allocator *)0x0) {
      local_1e8 = (void *)0x0;
      local_1c8 = (void *)0x0;
      iVar9 = posix_memalign((void **)&local_1c8,0x10,uVar40 | 4);
      if (iVar9 == 0) {
        local_1e8 = local_1c8;
      }
    }
    else {
      iVar9 = (*local_c0->_vptr_Allocator[2])();
      local_1e8 = (void *)CONCAT44(extraout_var_00,iVar9);
    }
    local_110 = (int *)((long)local_1e8 + uVar40);
    *(undefined4 *)((long)local_1e8 + uVar40) = 1;
  }
  local_1b0 = CONCAT44(local_1b0._4_4_,uVar8) & 0xfffffffffffffffc;
  local_148._0_8_ = SEXT48((int)uVar17);
  if (0 < (int)uVar8 >> 2) {
    local_128 = (float)(uVar17 & 0xfffffffe);
    uVar12 = CONCAT44(0,(int)uVar8 >> 2);
    local_138._0_8_ = uVar12;
    lVar31 = local_148._0_8_ * 4;
    local_d8._0_8_ = lVar31;
    lVar32 = (long)pvVar14 + local_148._0_8_;
    pvVar34 = (void *)((long)pvVar14 + local_148._0_8_ * 2);
    pvVar37 = (void *)(local_148._0_8_ * 3 + (long)pvVar14);
    uVar40 = 0;
    pvVar26 = local_1e8;
    pvVar43 = pvVar14;
    do {
      local_188 = pvVar26;
      local_198 = uVar40;
      puVar38 = (undefined1 *)(uVar11 * local_198 + (long)local_1e8);
      if ((int)uVar17 < 2) {
        pvVar26 = (void *)(local_198 * 4 * local_148._0_8_ + (long)pvVar14);
        pvVar13 = (void *)((local_198 * 4 + 1) * local_148._0_8_ + (long)pvVar14);
        pvVar29 = (void *)((local_198 * 4 + 2) * local_148._0_8_ + (long)pvVar14);
        pvVar22 = (void *)((local_198 * 4 + 3) * local_148._0_8_ + (long)pvVar14);
        fVar19 = 0.0;
      }
      else {
        lVar36 = 0;
        do {
          puVar33 = puVar38;
          puVar38 = (undefined1 *)((long)local_188 + lVar36 * 4);
          *puVar38 = *(undefined1 *)((long)pvVar43 + lVar36);
          puVar38[1] = *(undefined1 *)((long)pvVar43 + lVar36 + 1);
          puVar38[2] = *(undefined1 *)(lVar32 + lVar36);
          puVar38[3] = *(undefined1 *)(lVar32 + 1 + lVar36);
          puVar38[4] = *(undefined1 *)((long)pvVar34 + lVar36);
          puVar38[5] = *(undefined1 *)((long)pvVar34 + lVar36 + 1);
          puVar38[6] = *(undefined1 *)((long)pvVar37 + lVar36);
          puVar38[7] = *(undefined1 *)((long)pvVar37 + lVar36 + 1);
          lVar21 = lVar36 + 2;
          iVar9 = (int)lVar36;
          puVar38 = puVar38 + 8;
          lVar36 = lVar21;
        } while (iVar9 + 3 < (int)uVar17);
        puVar38 = puVar33 + 8;
        pvVar26 = (void *)(lVar21 + (long)pvVar43);
        pvVar13 = (void *)(lVar32 + lVar21);
        pvVar29 = (void *)((long)pvVar34 + lVar21);
        pvVar22 = (void *)(lVar21 + (long)pvVar37);
        fVar19 = local_128;
      }
      if ((int)fVar19 < (int)uVar17) {
        lVar36 = 0;
        do {
          puVar38[lVar36 * 4] = *(undefined1 *)((long)pvVar26 + lVar36);
          puVar38[lVar36 * 4 + 1] = *(undefined1 *)((long)pvVar13 + lVar36);
          puVar38[lVar36 * 4 + 2] = *(undefined1 *)((long)pvVar29 + lVar36);
          puVar38[lVar36 * 4 + 3] = *(undefined1 *)((long)pvVar22 + lVar36);
          lVar36 = lVar36 + 1;
        } while (uVar17 - (int)fVar19 != (int)lVar36);
      }
      pvVar43 = (void *)((long)pvVar43 + lVar31);
      lVar32 = lVar32 + lVar31;
      pvVar34 = (void *)((long)pvVar34 + lVar31);
      pvVar37 = (void *)((long)pvVar37 + lVar31);
      uVar40 = local_198 + 1;
      pvVar26 = (void *)((long)local_188 + uVar11);
    } while (local_198 + 1 != uVar12);
  }
  if ((float)local_1b0 != (float)uVar8) {
    lVar32 = (long)(int)(float)local_1b0;
    do {
      puVar38 = (undefined1 *)(lVar32 * local_148._0_8_ + (long)pvVar14);
      uVar27 = (uint)lVar32;
      uVar10 = uVar27 + 3;
      if (-1 < (int)uVar27) {
        uVar10 = uVar27;
      }
      puVar33 = (undefined1 *)
                ((long)(int)(((int)uVar10 >> 2) + (uVar27 - (uVar10 & 0xfffffffc))) * uVar11 +
                (long)local_1e8);
      if ((int)uVar17 < 2) {
        uVar27 = 0;
      }
      else {
        iVar9 = 1;
        do {
          *puVar33 = *puVar38;
          puVar33[1] = puVar38[1];
          puVar33 = puVar33 + 2;
          puVar38 = puVar38 + 2;
          iVar9 = iVar9 + 2;
          uVar27 = uVar17 & 0xfffffffe;
        } while (iVar9 < (int)uVar17);
      }
      if ((int)uVar27 < (int)uVar17) {
        lVar31 = 0;
        do {
          puVar33[lVar31] = puVar38[lVar31];
          lVar31 = lVar31 + 1;
        } while (uVar17 - uVar27 != (int)lVar31);
      }
      lVar32 = lVar32 + 1;
    } while (lVar32 < (int)uVar8);
  }
  uVar27 = (uint)local_170;
  uVar10 = uVar27 + 3;
  if (-1 < (int)uVar27) {
    uVar10 = uVar27;
  }
  uVar42 = uVar27 + 3;
  if (-1 < (int)uVar27) {
    uVar42 = uVar27;
  }
  local_40 = opt->workspace_allocator;
  uVar40 = (long)(int)((uVar27 - (uVar42 & 0xfffffffc)) + ((int)uVar10 >> 2)) * uVar11;
  if (uVar40 == 0) {
    local_1e0 = (void *)0x0;
    local_78 = (int *)0x0;
  }
  else {
    if (local_40 == (Allocator *)0x0) {
      local_1e0 = (void *)0x0;
      local_1c8 = (void *)0x0;
      iVar9 = posix_memalign((void **)&local_1c8,0x10,uVar40 | 4);
      if (iVar9 == 0) {
        local_1e0 = local_1c8;
      }
    }
    else {
      iVar9 = (*local_40->_vptr_Allocator[2])(local_40);
      local_1e0 = (void *)CONCAT44(extraout_var_01,iVar9);
    }
    local_78 = (int *)((long)local_1e0 + uVar40);
    *(undefined4 *)((long)local_1e0 + uVar40) = 1;
  }
  fVar19 = (float)((int)local_170 >> 2);
  local_70 = local_170 & 0xfffffffffffffffc;
  local_60 = (ulong)(uint)fVar19;
  if (0 < (int)fVar19) {
    local_198 = CONCAT44(local_198._4_4_,uVar17) & 0xfffffffffffffffe;
    iVar18 = (int)local_1a8 * kernel_h * kernel_w;
    iVar9 = iVar18 * 3;
    iVar18 = iVar18 * 2;
    iVar24 = 0;
    uVar40 = 0;
    pvVar34 = local_1e0;
    uVar27 = uVar17;
    do {
      puVar38 = (undefined1 *)(uVar11 * uVar40 + (long)local_1e0);
      local_1a8 = (undefined1 *)CONCAT44(local_1a8._4_4_,iVar9);
      if ((int)uVar17 < 2) {
        iVar44 = (int)uVar40;
        lVar31 = (long)&local_e8->data + (long)(int)((iVar44 * 4 + 3) * uVar17);
        lVar32 = (long)&local_e8->data + (long)(int)((iVar44 * 4 + 2) * uVar17);
        lVar21 = (long)&local_e8->data + (long)(int)((iVar44 * 4 + 1) * uVar17);
        lVar36 = (long)&local_e8->data + (long)(int)(iVar44 * 4 * uVar17);
        iVar44 = 0;
      }
      else {
        lVar32 = 0;
        do {
          puVar33 = puVar38;
          puVar38 = (undefined1 *)((long)pvVar34 + lVar32 * 4);
          *puVar38 = *(undefined1 *)((long)&local_e8->data + lVar32 + iVar24);
          puVar38[1] = *(undefined1 *)((long)&local_e8->data + lVar32 + (long)iVar24 + 1);
          puVar38[2] = *(undefined1 *)((long)&local_e8->data + lVar32 + (int)uVar27);
          puVar38[3] = *(undefined1 *)((long)&local_e8->data + lVar32 + (long)(int)uVar27 + 1);
          puVar38[4] = *(undefined1 *)((long)&local_e8->data + lVar32 + iVar18);
          puVar38[5] = *(undefined1 *)((long)&local_e8->data + lVar32 + (long)iVar18 + 1);
          puVar38[6] = *(undefined1 *)((long)&local_e8->data + lVar32 + iVar9);
          puVar38[7] = *(undefined1 *)((long)&local_e8->data + lVar32 + (long)iVar9 + 1);
          lVar36 = lVar32 + 2;
          iVar44 = (int)lVar32;
          lVar32 = lVar36;
          puVar38 = puVar38 + 8;
        } while (iVar44 + 3 < (int)uVar17);
        puVar38 = puVar33 + 8;
        lVar31 = (long)&local_e8->data + lVar36 + iVar9;
        lVar32 = (long)&local_e8->data + lVar36 + iVar18;
        lVar21 = (long)&local_e8->data + lVar36 + (int)uVar27;
        lVar36 = (long)&local_e8->data + lVar36 + iVar24;
        iVar44 = (int)(float)local_198;
      }
      if (iVar44 < (int)uVar17) {
        lVar41 = 0;
        do {
          puVar38[lVar41 * 4] = *(undefined1 *)(lVar36 + lVar41);
          puVar38[lVar41 * 4 + 1] = *(undefined1 *)(lVar21 + lVar41);
          puVar38[lVar41 * 4 + 2] = *(undefined1 *)(lVar32 + lVar41);
          puVar38[lVar41 * 4 + 3] = *(undefined1 *)(lVar31 + lVar41);
          lVar41 = lVar41 + 1;
        } while (uVar17 - iVar44 != (int)lVar41);
      }
      uVar40 = uVar40 + 1;
      pvVar34 = (void *)((long)pvVar34 + uVar11);
      iVar9 = iVar9 + (int)local_f8;
      iVar18 = iVar18 + (int)local_f8;
      uVar27 = uVar27 + (int)local_f8;
      iVar24 = iVar24 + (int)local_f8;
    } while (uVar40 != local_60);
  }
  if ((int)local_70 != (int)local_170) {
    uVar40 = local_70;
    do {
      uVar27 = (uint)uVar40;
      uVar10 = uVar27 + 3;
      if (-1 < (int)uVar27) {
        uVar10 = uVar27;
      }
      puVar38 = (undefined1 *)
                ((long)(int)(((int)uVar10 >> 2) + (uVar27 - (uVar10 & 0xfffffffc))) * uVar11 +
                (long)local_1e0);
      puVar33 = (undefined1 *)((long)&local_e8->data + (long)(int)(uVar17 * uVar27));
      if ((int)uVar17 < 2) {
        uVar27 = 0;
      }
      else {
        iVar9 = 1;
        do {
          *puVar38 = *puVar33;
          puVar38[1] = puVar33[1];
          puVar38 = puVar38 + 2;
          puVar33 = puVar33 + 2;
          iVar9 = iVar9 + 2;
          uVar27 = uVar17 & 0xfffffffe;
        } while (iVar9 < (int)uVar17);
      }
      if ((int)uVar27 < (int)uVar17) {
        lVar32 = 0;
        do {
          puVar38[lVar32] = puVar33[lVar32];
          lVar32 = lVar32 + 1;
        } while (uVar17 - uVar27 != (int)lVar32);
      }
      uVar40 = uVar40 + 1;
    } while ((long)uVar40 < (long)local_170);
  }
  local_48 = (undefined1 *)(ulong)uVar8;
  local_188._0_4_ = fVar19;
  if (0 < (int)fVar19) {
    local_154 = uVar17 & 0xfffffffe;
    uVar40 = 0;
    do {
      lVar32 = uVar40 * 4 + 1;
      lVar31 = uVar40 * 4 + 2;
      lVar36 = uVar40 * 4 + 3;
      if (_bias == (Mat *)0x0) {
        uVar46 = 0;
        local_188._0_4_ = 0.0;
        uVar52 = 0;
        uVar53 = 0;
      }
      else {
        local_188._0_4_ = *(float *)(&_bias->data + uVar40 * 2);
        uVar52 = *(undefined4 *)((long)&_bias->data + uVar40 * 0x10 + 4);
        uVar46 = *(undefined4 *)(&_bias->refcount + uVar40 * 2);
        uVar53 = *(undefined4 *)((long)&_bias->refcount + uVar40 * 0x10 + 4);
      }
      local_198 = CONCAT44(local_198._4_4_,uVar46);
      sVar3 = local_68->cstep;
      pvVar34 = local_68->data;
      sVar4 = local_68->elemsize;
      puVar39 = (undefined1 *)(uVar40 * 4 * sVar3 * sVar4 + (long)pvVar34);
      puVar33 = (undefined1 *)(sVar3 * lVar32 * sVar4 + (long)pvVar34);
      puVar38 = (undefined1 *)(sVar3 * lVar31 * sVar4 + (long)pvVar34);
      pcVar35 = (char *)(sVar3 * lVar36 * sVar4 + (long)pvVar34);
      pfVar5 = (scale_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_148._0_4_ = pfVar5[uVar40 * 8];
      local_e8 = (Mat *)CONCAT44(local_e8._4_4_,pfVar5[uVar40 * 8 + 1]);
      local_f8 = pfVar5[lVar32 * 2];
      local_128 = pfVar5[lVar32 * 2 + 1];
      local_14c = pfVar5[lVar36 * 2];
      local_150 = pfVar5[lVar36 * 2 + 1];
      local_138._0_4_ = uVar52;
      local_d8._0_4_ = uVar53;
      local_1b0 = CONCAT44(local_1b0._4_4_,pfVar5[lVar31 * 2]);
      local_160 = CONCAT44(local_160._4_4_,pfVar5[lVar31 * 2 + 1]);
      local_58 = uVar40;
      if ((int)uVar8 < 4) {
        puVar15 = (undefined1 *)0x0;
      }
      else {
        local_100 = (char *)(uVar11 * uVar40 + (long)local_1e0);
        puVar15 = (undefined1 *)0x0;
        local_168 = puVar33;
        do {
          puVar33 = local_168;
          pvVar14 = (void *)(((ulong)puVar15 >> 2) * uVar11 + (long)local_1e8);
          local_1c8 = (void *)0x0;
          uStack_1c0 = 0;
          local_a8[8] = 0;
          local_a8[9] = 0;
          local_a8[10] = 0;
          local_a8[0xb] = 0;
          local_a8[4] = 0;
          local_a8[5] = 0;
          local_a8[6] = 0;
          local_a8[7] = 0;
          local_a8[0] = 0;
          local_a8[1] = 0;
          local_a8[2] = 0;
          local_a8[3] = 0;
          pcVar20 = local_100;
          uVar27 = 0;
          if (1 < (int)uVar17) {
            iVar9 = 0;
            do {
              lVar32 = 0;
              do {
                iVar18 = (int)*(char *)((long)pvVar14 + lVar32) * (int)*pcVar20 +
                         *(int *)((long)&local_1c8 + lVar32 * 2);
                *(int *)((long)&local_1c8 + lVar32 * 2) = iVar18;
                *(int *)((long)&local_1c8 + lVar32 * 2) =
                     (int)*(char *)((long)pvVar14 + lVar32 + 1) * (int)pcVar20[1] + iVar18;
                iVar18 = (int)*(char *)((long)pvVar14 + lVar32) * (int)pcVar20[2] +
                         *(int *)((long)local_a8 + lVar32 * 2 + 0x20);
                *(int *)((long)local_a8 + lVar32 * 2 + 0x20) = iVar18;
                *(int *)((long)local_a8 + lVar32 * 2 + 0x20) =
                     (int)*(char *)((long)pvVar14 + lVar32 + 1) * (int)pcVar20[3] + iVar18;
                iVar18 = (int)*(char *)((long)pvVar14 + lVar32) * (int)pcVar20[4] +
                         *(int *)((long)local_a8 + lVar32 * 2 + 0x10);
                *(int *)((long)local_a8 + lVar32 * 2 + 0x10) = iVar18;
                *(int *)((long)local_a8 + lVar32 * 2 + 0x10) =
                     (int)*(char *)((long)pvVar14 + lVar32 + 1) * (int)pcVar20[5] + iVar18;
                iVar18 = (int)*(char *)((long)pvVar14 + lVar32) * (int)pcVar20[6] +
                         *(int *)((long)local_a8 + lVar32 * 2);
                *(int *)((long)local_a8 + lVar32 * 2) = iVar18;
                *(int *)((long)local_a8 + lVar32 * 2) =
                     (int)*(char *)((long)pvVar14 + lVar32 + 1) * (int)pcVar20[7] + iVar18;
                lVar32 = lVar32 + 2;
              } while (lVar32 != 8);
              pcVar20 = pcVar20 + 8;
              pvVar14 = (void *)((long)pvVar14 + 8);
              iVar18 = iVar9 + 3;
              iVar9 = iVar9 + 2;
              uVar27 = local_154;
            } while (iVar18 < (int)uVar17);
          }
          if ((int)uVar27 < (int)uVar17) {
            do {
              lVar32 = 0;
              do {
                piVar1 = (int *)((long)&local_1c8 + lVar32 * 4);
                *piVar1 = *piVar1 + (int)*(char *)((long)pvVar14 + lVar32) * (int)*pcVar20;
                local_a8[lVar32 + 8] =
                     local_a8[lVar32 + 8] + (int)*(char *)((long)pvVar14 + lVar32) * (int)pcVar20[1]
                ;
                local_a8[lVar32 + 4] =
                     local_a8[lVar32 + 4] + (int)*(char *)((long)pvVar14 + lVar32) * (int)pcVar20[2]
                ;
                local_a8[lVar32] =
                     local_a8[lVar32] + (int)*(char *)((long)pvVar14 + lVar32) * (int)pcVar20[3];
                lVar32 = lVar32 + 1;
              } while (lVar32 != 4);
              pcVar20 = pcVar20 + 4;
              pvVar14 = (void *)((long)pvVar14 + 4);
              uVar27 = uVar27 + 1;
            } while (uVar27 != uVar17);
          }
          lVar32 = 0;
          local_1a8 = puVar38;
          local_b0 = puVar15;
          do {
            fVar19 = roundf(((float)*(int *)((long)&local_1c8 + lVar32 * 4) * (float)local_148._0_4_
                            + (float)local_188) * (float)local_e8);
            iVar9 = (int)fVar19;
            if (iVar9 < -0x7e) {
              iVar9 = -0x7f;
            }
            uVar6 = (undefined1)iVar9;
            if (0x7e < iVar9) {
              uVar6 = 0x7f;
            }
            puVar39[lVar32] = uVar6;
            fVar19 = roundf(((float)local_a8[lVar32 + 8] * local_f8 + (float)local_138._0_4_) *
                            local_128);
            iVar9 = (int)fVar19;
            if (iVar9 < -0x7e) {
              iVar9 = -0x7f;
            }
            uVar6 = (undefined1)iVar9;
            if (0x7e < iVar9) {
              uVar6 = 0x7f;
            }
            puVar33[lVar32] = uVar6;
            fVar19 = roundf(((float)local_a8[lVar32 + 4] * (float)local_1b0 + (float)local_198) *
                            (float)local_160);
            iVar9 = (int)fVar19;
            if (iVar9 < -0x7e) {
              iVar9 = -0x7f;
            }
            if (0x7e < iVar9) {
              iVar9 = 0x7f;
            }
            local_1a8[lVar32] = (char)iVar9;
            fVar19 = roundf(((float)local_a8[lVar32] * local_14c + (float)local_d8._0_4_) *
                            local_150);
            iVar9 = (int)fVar19;
            if (iVar9 < -0x7e) {
              iVar9 = -0x7f;
            }
            cVar7 = (char)iVar9;
            if (0x7e < iVar9) {
              cVar7 = '\x7f';
            }
            pcVar35[lVar32] = cVar7;
            lVar32 = lVar32 + 1;
          } while (lVar32 != 4);
          puVar39 = puVar39 + 4;
          puVar33 = puVar33 + 4;
          puVar38 = local_1a8 + 4;
          pcVar35 = pcVar35 + 4;
          puVar15 = local_b0 + 4;
          pvVar14 = local_108;
          local_168 = puVar33;
        } while (local_b0 + 7 < local_48);
      }
      if ((int)puVar15 < (int)uVar8) {
        local_50 = (char *)(uVar11 * local_58 + (long)local_1e0);
        do {
          pcVar16 = (char *)((((uint)puVar15 & 3) + ((uint)((ulong)puVar15 >> 2) & 0x3fffffff)) *
                             uVar11 + (long)local_1e8);
          iVar9 = 0;
          pcVar20 = local_50;
          if ((int)uVar17 < 2) {
            iVar44 = 0;
            iVar24 = 0;
            iVar18 = 0;
            uVar27 = 0;
          }
          else {
            iVar18 = 0;
            iVar25 = 1;
            iVar24 = 0;
            iVar44 = 0;
            iVar9 = 0;
            do {
              iVar28 = (int)*pcVar16;
              iVar30 = (int)pcVar16[1];
              iVar9 = pcVar20[1] * iVar30 + *pcVar20 * iVar28 + iVar9;
              iVar44 = pcVar20[3] * iVar30 + pcVar20[2] * iVar28 + iVar44;
              iVar24 = pcVar20[5] * iVar30 + pcVar20[4] * iVar28 + iVar24;
              iVar18 = pcVar20[7] * iVar30 + pcVar20[6] * iVar28 + iVar18;
              pcVar20 = pcVar20 + 8;
              pcVar16 = pcVar16 + 2;
              iVar25 = iVar25 + 2;
              uVar27 = local_154;
            } while (iVar25 < (int)uVar17);
          }
          if ((int)uVar27 < (int)uVar17) {
            lVar32 = 0;
            do {
              iVar25 = (int)pcVar16[lVar32];
              iVar9 = iVar9 + pcVar20[lVar32 * 4] * iVar25;
              iVar44 = iVar44 + pcVar20[lVar32 * 4 + 1] * iVar25;
              iVar24 = iVar24 + pcVar20[lVar32 * 4 + 2] * iVar25;
              iVar18 = iVar18 + pcVar20[lVar32 * 4 + 3] * iVar25;
              lVar32 = lVar32 + 1;
            } while (uVar17 - uVar27 != (int)lVar32);
          }
          local_1a8 = puVar38;
          local_168 = puVar33;
          local_100 = pcVar35;
          local_b0 = puVar39;
          local_38 = puVar15;
          fVar19 = roundf(((float)iVar9 * (float)local_148._0_4_ + (float)local_188) *
                          (float)local_e8);
          puVar39 = local_b0;
          iVar9 = (int)fVar19;
          if (iVar9 < -0x7e) {
            iVar9 = -0x7f;
          }
          uVar6 = (undefined1)iVar9;
          if (0x7e < iVar9) {
            uVar6 = 0x7f;
          }
          *local_b0 = uVar6;
          fVar19 = roundf(((float)iVar44 * local_f8 + (float)local_138._0_4_) * local_128);
          puVar33 = local_168;
          iVar9 = (int)fVar19;
          if (iVar9 < -0x7e) {
            iVar9 = -0x7f;
          }
          if (0x7e < iVar9) {
            iVar9 = 0x7f;
          }
          *local_168 = (char)iVar9;
          fVar19 = roundf(((float)iVar24 * (float)local_1b0 + (float)local_198) * (float)local_160);
          puVar38 = local_1a8;
          iVar9 = (int)fVar19;
          if (iVar9 < -0x7e) {
            iVar9 = -0x7f;
          }
          if (0x7e < iVar9) {
            iVar9 = 0x7f;
          }
          *local_1a8 = (char)iVar9;
          fVar19 = roundf(((float)iVar18 * local_14c + (float)local_d8._0_4_) * local_150);
          iVar9 = (int)fVar19;
          if (iVar9 < -0x7e) {
            iVar9 = -0x7f;
          }
          if (0x7e < iVar9) {
            iVar9 = 0x7f;
          }
          *local_100 = (char)iVar9;
          puVar39 = puVar39 + 1;
          puVar33 = puVar33 + 1;
          puVar38 = puVar38 + 1;
          pcVar35 = local_100 + 1;
          uVar27 = (int)local_38 + 1;
          puVar15 = (undefined1 *)(ulong)uVar27;
        } while (uVar27 != uVar8);
      }
      uVar40 = local_58 + 1;
    } while (uVar40 != local_60);
  }
  if ((int)local_70 != (int)local_170) {
    local_1b0 = CONCAT44(local_1b0._4_4_,uVar17) & 0xfffffffffffffffe;
    lVar32 = (long)(int)local_70;
    uVar40 = local_170;
    do {
      if (_bias == (Mat *)0x0) {
        auVar47 = ZEXT812(0);
      }
      else {
        auVar47._4_8_ = 0;
        auVar47._0_4_ = *(uint *)((long)&_bias->data + lVar32 * 4);
      }
      auVar51._12_4_ = 0;
      auVar51._0_12_ = auVar47;
      puVar23 = (undefined4 *)(local_68->cstep * lVar32 * local_68->elemsize + (long)local_68->data)
      ;
      uVar12 = 0;
      pfVar5 = (scale_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar19 = pfVar5[lVar32 * 2];
      local_d8 = ZEXT416((uint)fVar19);
      fVar2 = pfVar5[lVar32 * 2 + 1];
      local_148 = ZEXT416((uint)fVar2);
      local_160 = lVar32;
      local_138 = auVar51;
      if (3 < (int)uVar8) {
        uVar27 = (uint)lVar32;
        uVar10 = uVar27 + 3;
        if (-1 < (int)uVar27) {
          uVar10 = uVar27;
        }
        pcVar35 = (char *)((long)(int)(((int)uVar10 >> 2) + (uVar27 - (uVar10 & 0xfffffffc))) *
                           uVar11 + (long)local_1e0);
        local_e8 = (Mat *)CONCAT44(fVar19,fVar19);
        local_138._0_4_ = auVar47._0_4_;
        local_f8 = (float)local_138._0_4_;
        fStack_f4 = (float)local_138._0_4_;
        fStack_f0 = (float)local_138._0_4_;
        fStack_ec = (float)local_138._0_4_;
        uVar45 = 0;
        local_128 = fVar2;
        fStack_124 = fVar2;
        fStack_120 = fVar2;
        fStack_11c = fVar2;
        fStack_e0 = fVar19;
        fStack_dc = fVar19;
        do {
          pvVar34 = (void *)((uVar45 >> 2) * uVar11 + (long)local_1e8);
          uVar27 = 0;
          local_1c8 = (void *)0x0;
          uStack_1c0 = 0;
          pcVar20 = pcVar35;
          if (1 < (int)uVar17) {
            iVar9 = 0;
            do {
              lVar32 = 0;
              do {
                iVar18 = (int)*(char *)((long)pvVar34 + lVar32 * 2) * (int)*pcVar20 +
                         *(int *)((long)&local_1c8 + lVar32 * 4);
                *(int *)((long)&local_1c8 + lVar32 * 4) = iVar18;
                *(int *)((long)&local_1c8 + lVar32 * 4) =
                     (int)*(char *)((long)pvVar34 + lVar32 * 2 + 1) * (int)pcVar20[1] + iVar18;
                lVar32 = lVar32 + 1;
              } while (lVar32 != 4);
              pcVar20 = pcVar20 + 2;
              pvVar34 = (void *)((long)pvVar34 + 8);
              iVar18 = iVar9 + 3;
              iVar9 = iVar9 + 2;
            } while (iVar18 < (int)uVar17);
            uVar27 = (uint)(float)local_1b0;
          }
          if ((int)uVar27 < (int)uVar17) {
            do {
              lVar32 = 0;
              do {
                piVar1 = (int *)((long)&local_1c8 + lVar32 * 4);
                *piVar1 = *piVar1 + (int)*(char *)((long)pvVar34 + lVar32) * (int)*pcVar20;
                lVar32 = lVar32 + 1;
              } while (lVar32 != 4);
              pcVar20 = pcVar20 + 1;
              pvVar34 = (void *)((long)pvVar34 + 4);
              uVar27 = uVar27 + 1;
            } while (uVar27 != uVar17);
          }
          fStack_1a0 = ((float)(int)uStack_1c0 * fStack_e0 + fStack_f0) * fStack_120;
          fStack_19c = ((float)uStack_1c0._4_4_ * fStack_dc + fStack_ec) * fStack_11c;
          local_1a8 = (undefined1 *)
                      CONCAT44(((float)local_1c8._4_4_ * local_e8._4_4_ + fStack_f4) * fStack_124,
                               ((float)(int)local_1c8 * (float)local_e8 + local_f8) * local_128);
          local_198._0_4_ = roundf(fStack_19c);
          local_198._4_4_ = extraout_XMM0_Db;
          fVar19 = roundf(fStack_1a0);
          uStack_18c = local_198._4_4_;
          local_198 = CONCAT44((float)local_198,fVar19);
          local_188._0_4_ = roundf((float)local_1a8);
          local_188._4_4_ = extraout_XMM0_Db_00;
          fVar19 = roundf(local_1a8._4_4_);
          auVar48._0_4_ = (int)(float)local_188;
          auVar48._4_4_ = (int)fVar19;
          auVar48._8_4_ = (int)(float)local_198;
          auVar48._12_4_ = (int)(float)(local_198 >> 0x20);
          auVar50._0_4_ = -(uint)((int)DAT_00177b90 < auVar48._0_4_);
          auVar50._4_4_ = -(uint)(DAT_00177b90._4_4_ < auVar48._4_4_);
          auVar50._8_4_ = -(uint)(DAT_00177b90._8_4_ < auVar48._8_4_);
          auVar50._12_4_ = -(uint)(DAT_00177b90._12_4_ < auVar48._12_4_);
          auVar51 = ~auVar50 & _DAT_00177b90 | auVar48 & auVar50;
          auVar49._0_4_ = -(uint)(auVar51._0_4_ < (int)DAT_00177ba0);
          auVar49._4_4_ = -(uint)(auVar51._4_4_ < DAT_00177ba0._4_4_);
          auVar49._8_4_ = -(uint)(auVar51._8_4_ < DAT_00177ba0._8_4_);
          auVar49._12_4_ = -(uint)(auVar51._12_4_ < DAT_00177ba0._12_4_);
          auVar51 = ~auVar49 & _DAT_00177ba0 | auVar51 & auVar49;
          auVar51 = packssdw(auVar51,auVar51);
          auVar51 = packsswb(auVar51,auVar51);
          *puVar23 = auVar51._0_4_;
          puVar23 = puVar23 + 1;
          uVar12 = uVar45 + 4;
          puVar38 = (undefined1 *)(uVar45 + 7);
          uVar40 = local_170;
          uVar45 = uVar12;
        } while (puVar38 < local_48);
      }
      if ((int)uVar12 < (int)uVar8) {
        uVar27 = (uint)local_160;
        uVar10 = uVar27 + 3;
        if (-1 < (int)uVar27) {
          uVar10 = uVar27;
        }
        do {
          if ((int)uVar17 < 1) {
            fVar19 = 0.0;
          }
          else {
            lVar32 = 0;
            iVar9 = 0;
            do {
              iVar9 = iVar9 + (int)*(char *)((long)local_1e8 +
                                            lVar32 + (((uint)uVar12 & 3) +
                                                     ((uint)(uVar12 >> 2) & 0x3fffffff)) * uVar11) *
                              (int)*(char *)((long)local_1e0 +
                                            lVar32 + (long)(int)(((int)uVar10 >> 2) +
                                                                (uVar27 - (uVar10 & 0xfffffffc))) *
                                                     uVar11);
              lVar32 = lVar32 + 1;
            } while (uVar17 != (uint)lVar32);
            fVar19 = (float)iVar9;
          }
          fVar19 = roundf((fVar19 * (float)local_d8._0_4_ + (float)local_138._0_4_) *
                          (float)local_148._0_4_);
          iVar9 = (int)fVar19;
          if (iVar9 < -0x7e) {
            iVar9 = -0x7f;
          }
          uVar6 = (undefined1)iVar9;
          if (0x7e < iVar9) {
            uVar6 = 0x7f;
          }
          *(undefined1 *)puVar23 = uVar6;
          puVar23 = (undefined4 *)((long)puVar23 + 1);
          uVar42 = (uint)uVar12 + 1;
          uVar12 = (ulong)uVar42;
        } while (uVar42 != uVar8);
      }
      lVar32 = local_160 + 1;
    } while (lVar32 < (long)uVar40);
  }
  piVar1 = local_110;
  if (local_78 != (int *)0x0) {
    LOCK();
    *local_78 = *local_78 + -1;
    UNLOCK();
    if (*local_78 == 0) {
      if (local_40 == (Allocator *)0x0) {
        if (local_1e0 != (void *)0x0) {
          free(local_1e0);
        }
      }
      else {
        (*local_40->_vptr_Allocator[3])(local_40,local_1e0);
      }
    }
  }
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_c0 == (Allocator *)0x0) {
        if (local_1e8 != (void *)0x0) {
          free(local_1e8);
        }
      }
      else {
        (*local_c0->_vptr_Allocator[3])(local_c0,local_1e8);
      }
    }
  }
  if (local_1b8 != (int *)0x0) {
    LOCK();
    *local_1b8 = *local_1b8 + -1;
    UNLOCK();
    if (*local_1b8 == 0) {
      if (local_b8 == (Allocator *)0x0) {
        if (pvVar14 != (void *)0x0) {
          free(pvVar14);
        }
      }
      else {
        (*local_b8->_vptr_Allocator[3])(local_b8,pvVar14);
      }
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat &_bias, std::vector<float> scale_requant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h*kernel_w*inch, outw*outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;
    
        for (int i=0; i<outh; i++)
        {
            for (int j=0; j<outw; j++)
            {
                for (int p=0; p<inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u=0; u<kernel_h; u++)
                    {
                        for (int v=0; v<kernel_w; v++)
                        {    
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }                
                }
            }
        }
    }    

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh; // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i+1);
            const signed char* img2 = bottom_im2row.row<signed char>(i+2);
            const signed char* img3 = bottom_im2row.row<signed char>(i+3);

            signed char* tmpptr = bottom_tm.channel(i/4);

            int q = 0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;                
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i/4 + i%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }       
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4*kernel_size, inch, outch/4 + outch%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p+0)*inch*kernel_size;
            const signed char* k1 = kernel + (p+1)*inch*kernel_size;
            const signed char* k2 = kernel + (p+2)*inch*kernel_size;
            const signed char* k3 = kernel + (p+3)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4);

            int q=0;
            for (; q+1<inch*kernel_size; q+=2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            { 
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }           
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            const signed char* k0 = kernel + (p+0)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4 + p%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }    

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i = pp * 4;

            signed char* output0 = top_blob.channel(i);
            signed char* output1 = top_blob.channel(i+1);
            signed char* output2 = top_blob.channel(i+2);
            signed char* output3 = top_blob.channel(i+3);

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i+1] : 0.f;
            const float bias2 = bias ? bias[i+2] : 0.f;
            const float bias3 = bias ? bias[i+3] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];
            const float scale_requant_in1  = scale_requant[2*(i+1)];
            const float scale_requant_out1 = scale_requant[2*(i+1)+1];
            const float scale_requant_in2  = scale_requant[2*(i+2)];
            const float scale_requant_out2 = scale_requant[2*(i+2)+1];
            const float scale_requant_in3  = scale_requant[2*(i+3)];
            const float scale_requant_out3 = scale_requant[2*(i+3)+1];

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4);
                
                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};
               
                int k=0;

                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2*n];   // k0
                        sum0[n] += (int)va[1] * vb[2*n+1];

                        sum1[n] += (int)va[2] * vb[2*n];   // k1
                        sum1[n] += (int)va[3] * vb[2*n+1];

                        sum2[n] += (int)va[4] * vb[2*n];   // k2
                        sum2[n] += (int)va[5] * vb[2*n+1];

                        sum3[n] += (int)va[6] * vb[2*n];   // k3
                        sum3[n] += (int)va[7] * vb[2*n+1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = float2int8(((float)sum0[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                    output1[n] = float2int8(((float)sum1[n] * scale_requant_in1 + bias1) * scale_requant_out1);
                    output2[n] = float2int8(((float)sum2[n] * scale_requant_in2 + bias2) * scale_requant_out2);
                    output3[n] = float2int8(((float)sum3[n] * scale_requant_in3 + bias3) * scale_requant_out3);
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4);

                int k=0;

                for (; k+1<K; k=k+2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k<K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = float2int8(((float)sum0 * scale_requant_in0 + bias0) * scale_requant_out0);
                output1[0] = float2int8(((float)sum1 * scale_requant_in1 + bias1) * scale_requant_out1);
                output2[0] = float2int8(((float)sum2 * scale_requant_in2 + bias2) * scale_requant_out2);
                output3[0] = float2int8(((float)sum3 * scale_requant_in3 + bias3) * scale_requant_out3);

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            signed char* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];            

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4 + i%4);
                int sum[4] = {0};

                int k=0;
                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2*n];
                        sum[n] += (int)va[1] * vb[2*n+1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = float2int8(((float)sum[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                }
                output += 4;
            }

            for (; j<N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4 + i%4);

                for (int k=0; k<K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = float2int8(((float)sum * scale_requant_in0 + bias0) * scale_requant_out0);

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}